

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_multi.hpp
# Opt level: O0

void __thiscall Infector::Container::bindAsNothing<Booom>(Container *this)

{
  mapped_type *pmVar1;
  type_index local_38;
  type_index local_30;
  Binding local_28;
  undefined1 local_11;
  Container *pCStack_10;
  bool tests;
  Container *this_local;
  
  pCStack_10 = this;
  local_11 = reduced_type_tests<Booom>();
  must_not_have<Booom>(this);
  std::type_index::type_index(&local_30,(type_info *)&Booom::typeinfo);
  Binding::Binding(&local_28,local_30,false);
  std::type_index::type_index(&local_38,(type_info *)&Booom::typeinfo);
  pmVar1 = std::
           unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
           ::operator[](&this->typeMap,&local_38);
  (pmVar1->type)._M_target = local_28.type._M_target;
  pmVar1->single = local_28.single;
  return;
}

Assistant:

void Container::bindAsNothing(){
        bool tests = reduced_type_tests<T>(); // Compile time tests.
        (void) tests; //fix unused variable warning
        must_not_have<T>(); // A Concrete type can't be registered twice.


        typeMap[std::type_index(typeid(T))]
                = Binding(std::type_index(typeid(T)), false);
    }